

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

bool __thiscall
duckdb::ConflictManager::AddHit(ConflictManager *this,idx_t chunk_index,row_t row_id)

{
  bool bVar1;
  
  bVar1 = ShouldThrow(this,chunk_index);
  if ((!bVar1) && (this->mode != THROW)) {
    AddConflictInternal(this,chunk_index,row_id);
  }
  return bVar1;
}

Assistant:

bool ConflictManager::AddHit(idx_t chunk_index, row_t row_id) {
	D_ASSERT(chunk_index < input_size);
	// First check if this causes a conflict
	if (!IsConflict(LookupResultType::LOOKUP_HIT)) {
		return false;
	}

	// Then check if we should throw on a conflict
	if (ShouldThrow(chunk_index)) {
		return true;
	}
	if (mode == ConflictManagerMode::THROW) {
		// When our mode is THROW, and the chunk index is part of the previously scanned conflicts
		// then we ignore the conflict instead
		D_ASSERT(!ShouldThrow(chunk_index));
		return false;
	}
	D_ASSERT(conflict_info);
	// Because we don't throw, we need to register the conflict
	AddConflictInternal(chunk_index, row_id);
	return false;
}